

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftmgr.c
# Opt level: O2

ftmgr * alloc_ftmgr(char *name,chmgr *chmgr,uint32_t *mode)

{
  int iVar1;
  ftmgr *__ptr;
  void *pvVar2;
  long lVar3;
  stat statbuf;
  
  __ptr = (ftmgr *)malloc(0x100);
  iVar1 = stat(name,(stat *)&statbuf);
  if (-1 < iVar1) {
    *mode = statbuf.st_mode;
    (__ptr->pr).pr_total = statbuf.st_size;
    (__ptr->pr).pr_cursize = 0;
    (__ptr->pr).pr_time = 0;
    (__ptr->pr).pr_start = 0;
    (__ptr->pr).chmgr = chmgr;
    iVar1 = open(name,0);
    __ptr->fd = iVar1;
    if (-1 < iVar1) {
      __ptr->offset = 0;
      __ptr->chmgr = chmgr;
      __ptr->tts = '\0';
      __ptr->bitmap = 0xff;
      for (lVar3 = 0x40; lVar3 != 0x100; lVar3 = lVar3 + 0x18) {
        pvVar2 = malloc(0x1fb);
        *(void **)((long)__ptr->ftq + lVar3 + -0x38) = pvVar2;
      }
      return __ptr;
    }
  }
  free(__ptr);
  return (ftmgr *)0x0;
}

Assistant:

struct ftmgr *alloc_ftmgr(const char *name, struct chmgr *chmgr, uint32_t *mode)
{
    struct stat statbuf;
    struct ftmgr *ftmgr = (struct ftmgr*)malloc(sizeof(struct ftmgr));
    if(stat(name, &statbuf) < 0)
        goto _err;
    *mode = statbuf.st_mode;
    progress_init(&ftmgr->pr, statbuf.st_size, chmgr);

    ftmgr->fd = open(name, O_RDONLY);
    if(ftmgr->fd < 0)
        goto _err;

    ftmgr->offset = 0;
    ftmgr->chmgr = chmgr;
    ftmgr->tts = 0;
    ftmgr->bitmap = (__typeof__(ftmgr->bitmap))-1;
    for(int i = 0;i < FTQ_NR;i++) {
        ftmgr->ftq[i].blk = malloc(BLK_MTU);
    }
    return ftmgr;
_err:
    free(ftmgr);
    return NULL;
}